

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_manager.c
# Opt level: O0

void apx_connectionManager_detach(apx_connectionManager_t *self,apx_serverConnection_t *connection)

{
  adt_list_elem_t *pIter;
  adt_list_elem_t *iter;
  apx_serverConnection_t *connection_local;
  apx_connectionManager_t *self_local;
  
  if ((self != (apx_connectionManager_t *)0x0) && (connection != (apx_serverConnection_t *)0x0)) {
    pthread_spin_lock(&self->lock);
    pIter = adt_list_find(&self->active_connections,connection);
    if (pIter != (adt_list_elem_t *)0x0) {
      adt_list_erase(&self->active_connections,pIter);
      adt_list_insert(&self->inactive_connections,connection);
    }
    pthread_spin_unlock(&self->lock);
  }
  return;
}

Assistant:

void apx_connectionManager_detach(apx_connectionManager_t *self, apx_serverConnection_t *connection)
{
   if ( (self != 0) && (connection != 0))
   {
      adt_list_elem_t *iter;
      SPINLOCK_ENTER(self->lock);
      iter = adt_list_find(&self->active_connections, (void*)connection);
      if (iter != 0)
      {
         adt_list_erase(&self->active_connections, iter);
         adt_list_insert(&self->inactive_connections, connection);
      }
      SPINLOCK_LEAVE(self->lock);
   }
}